

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.h
# Opt level: O2

void embree::MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
               (EvalFunc *eval,Interval1f *interval,uint *numRoots,float *roots,uint maxNumRoots)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  Interval1f range;
  Interval1f local_40;
  float local_38;
  float local_34;
  
  motion_derivative_regression_test::run::EvalFunc::operator()
            ((EvalFunc *)&local_38,(Interval1f *)eval);
  if (((local_38 <= 0.0) && (0.0 <= local_34)) && (local_38 < local_34)) {
    local_40.lower = interval->lower;
    fVar2 = interval->upper;
    fVar6 = (fVar2 + local_40.lower) * 0.5;
    if (((fVar2 - local_40.lower < 1e-07) || (ABS(fVar6 - local_40.lower) < 1e-07)) ||
       (ABS(fVar6 - fVar2) < 1e-07)) {
      uVar3 = *numRoots;
      uVar4 = (ulong)uVar3;
      if (maxNumRoots < uVar3) {
        uVar4 = (ulong)maxNumRoots;
      }
      uVar5 = 0;
      do {
        if (uVar4 == uVar5) {
          if (uVar3 < maxNumRoots) {
            *numRoots = uVar3 + 1;
            roots[uVar3] = fVar6;
            uVar3 = *numRoots;
          }
          if (uVar3 <= maxNumRoots) {
            return;
          }
          puts("error: more roots than expected");
          return;
        }
        pfVar1 = roots + uVar5;
        uVar5 = uVar5 + 1;
      } while (0.0001 <= ABS(*pfVar1 - fVar6));
    }
    else {
      local_40.upper = fVar6;
      findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                (eval,&local_40,numRoots,roots,maxNumRoots);
      local_40.upper = interval->upper;
      local_40.lower = fVar6;
      findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                (eval,&local_40,numRoots,roots,maxNumRoots);
    }
  }
  return;
}

Assistant:

static void findRoots(

    Eval const& eval,
    Interval1f const& interval,
    unsigned int& numRoots,
    float* roots,
    unsigned int maxNumRoots)
  {
    Interval1f range = eval(interval);
    if (range.lower > 0 || range.upper < 0 || range.lower >= range.upper) return;

    const float split = 0.5f * (interval.upper + interval.lower);
    if (interval.upper-interval.lower < 1e-7f || abs(split-interval.lower) < 1e-7f ||  abs(split-interval.upper) < 1e-7f)
    {
      // check if the root already exists
      for (unsigned int k = 0; k < numRoots && k < maxNumRoots; ++k) {
        if (abs(roots[k]-split) < MOTION_DERIVATIVE_ROOT_EPSILON)
        return;
      }
      if (numRoots < maxNumRoots) {
        roots[numRoots++] = split;
      }
      if (numRoots > maxNumRoots) {
        printf("error: more roots than expected\n"); // FIXME: workaround for ICC2019.4 compiler bug under macOS
        return;
      }
      return;
    }

    findRoots(eval, Interval1f(interval.lower, split), numRoots, roots, maxNumRoots);
    findRoots(eval, Interval1f(split, interval.upper), numRoots, roots, maxNumRoots);
  }